

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O3

Vector3 * __thiscall COLLADABU::Math::Quaternion::operator*(Quaternion *this,Vector3 *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector3 *kSum;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar8 = this->x;
  dVar1 = (v->field_0).field_0.z;
  dVar5 = this->w + this->w;
  dVar2 = this->y;
  dVar11 = this->z;
  dVar3 = (v->field_0).field_0.x;
  dVar4 = (v->field_0).field_0.y;
  dVar7 = dVar1 * dVar2 - (v->field_0).field_0.y * dVar11;
  dVar9 = dVar3 * dVar11 - (v->field_0).field_0.z * dVar8;
  dVar6 = dVar4 * dVar8 - dVar3 * dVar2;
  dVar10 = dVar6 * dVar2 - dVar9 * dVar11;
  dVar11 = dVar7 * dVar11 - dVar6 * dVar8;
  dVar8 = dVar9 * dVar8 - dVar2 * dVar7;
  (kSum->field_0).field_0.x = dVar5 * dVar7 + dVar3 + dVar10 + dVar10;
  (kSum->field_0).field_0.y = dVar5 * dVar9 + dVar4 + dVar11 + dVar11;
  (kSum->field_0).field_0.z = dVar6 * dVar5 + dVar1 + dVar8 + dVar8;
  return kSum;
}

Assistant:

Vector3 Quaternion::operator* ( const Vector3& v ) const
        {
            // nVidia SDK implementation
            Vector3 uv, uuv;
            Vector3 qvec( x, y, z );
            uv = qvec.crossProduct( v );
            uuv = qvec.crossProduct( uv );
            uv *= ( 2.0f * w );
            uuv *= 2.0f;

            return v + uv + uuv;

        }